

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5IndexIter **ppFVar1;
  Fts5ExprNearset *pFVar2;
  Fts5ExprPhrase *pFVar3;
  Fts5IndexIter *pFVar4;
  u8 *puVar5;
  Fts5ExprNode *pNode_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  Fts5ExprTerm *pFVar14;
  
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  iVar7 = pNode->eType;
  if ((iVar7 == 9) || (iVar7 == 4)) {
    pFVar2 = pNode->pNear;
    iVar7 = pFVar2->nPhrase;
    if (0 < iVar7) {
      lVar12 = 0;
      do {
        iVar9 = 1;
        pFVar3 = pFVar2->apPhrase[lVar12];
        if (pFVar3->nTerm == 0) goto LAB_001e2f20;
        if (0 < pFVar3->nTerm) {
          lVar13 = 0;
          do {
            bVar6 = false;
            pFVar14 = pFVar3->aTerm + lVar13;
            do {
              pFVar4 = pFVar14->pIter;
              if (pFVar4 != (Fts5IndexIter *)0x0) {
                puVar5 = pFVar4[1].pData;
                fts5IterClose(pFVar4);
                puVar5[0x3c] = '\0';
                puVar5[0x3d] = '\0';
                puVar5[0x3e] = '\0';
                puVar5[0x3f] = '\0';
                pFVar14->pIter = (Fts5IndexIter *)0x0;
              }
              iVar7 = sqlite3Fts5IndexQuery
                                (pExpr->pIndex,pFVar14->pTerm,pFVar14->nQueryTerm,
                                 (uint)(pFVar3->aTerm[lVar13].bPrefix != '\0') +
                                 (uint)(pExpr->bDesc != 0) * 2,pFVar2->pColset,&pFVar14->pIter);
              if (iVar7 != 0) {
                return iVar7;
              }
              ppFVar1 = &pFVar14->pIter;
              pFVar14 = pFVar14->pSynonym;
              iVar9 = 1;
              if ((*ppFVar1)->bEof == '\0') {
                bVar6 = true;
              }
            } while (pFVar14 != (Fts5ExprTerm *)0x0);
            if (!bVar6) goto LAB_001e2f20;
            lVar13 = lVar13 + 1;
          } while (lVar13 < pFVar3->nTerm);
          iVar7 = pFVar2->nPhrase;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar7);
    }
    iVar9 = 0;
LAB_001e2f20:
    pNode->bEof = iVar9;
    goto LAB_001e2fc8;
  }
  if (pNode->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
    pNode->bEof = 1;
    return 0;
  }
  iVar9 = pNode->nChild;
  iVar10 = 0;
  iVar11 = 0;
  if (iVar9 < 1) {
    iVar8 = 0;
  }
  else {
    lVar12 = 6;
    do {
      pNode_00 = pNode->apChild[lVar12 + -6];
      iVar8 = fts5ExprNodeFirst(pExpr,pNode_00);
      iVar10 = iVar10 + pNode_00->bEof;
      iVar9 = pNode->nChild;
      if ((long)iVar9 <= lVar12 + -5) break;
      lVar12 = lVar12 + 1;
    } while (iVar8 == 0);
    iVar7 = pNode->eType;
    iVar11 = iVar10;
  }
  pNode->iRowid = pNode->apChild[0]->iRowid;
  if (iVar7 == 1) {
    if (iVar9 == iVar11) {
LAB_001e2fad:
      fts5ExprSetEof(pNode);
    }
  }
  else if (iVar7 == 2) {
    if (0 < iVar11) goto LAB_001e2fad;
  }
  else {
    pNode->bEof = pNode->apChild[0]->bEof;
  }
  if (iVar8 != 0) {
    return iVar8;
  }
  iVar9 = pNode->bEof;
LAB_001e2fc8:
  if (iVar9 == 0) {
    switch(pNode->eType) {
    case 1:
      fts5ExprNodeTest_OR(pExpr,pNode);
      break;
    case 2:
      iVar7 = fts5ExprNodeTest_AND(pExpr,pNode);
      return iVar7;
    default:
      iVar7 = fts5ExprNodeTest_NOT(pExpr,pNode);
      return iVar7;
    case 4:
      pFVar3 = pNode->pNear->apPhrase[0];
      pFVar4 = pFVar3->aTerm[0].pIter;
      iVar7 = pFVar4->nData;
      iVar9 = pExpr->pConfig->eDetail;
      (pFVar3->poslist).n = iVar7;
      if (iVar9 == 0) {
        (pFVar3->poslist).p = pFVar4->pData;
      }
      pNode->iRowid = pFVar4->iRowid;
      pNode->bNomatch = (uint)(iVar7 == 0);
      break;
    case 9:
      iVar7 = fts5ExprNodeTest_STRING(pExpr,pNode);
      return iVar7;
    }
  }
  return 0;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}